

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O1

_Bool gravity_env_get(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_class_t *pgVar2;
  gravity_fiber_t *fiber;
  char *__s;
  size_t sVar3;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [4096];
  
  pgVar2 = gravity_class_string;
  pgVar1 = args[1].isa;
  if (pgVar1 == gravity_class_string) {
    __s = getenv((char *)(args[1].field_1.p)->objclass);
    if (__s == (char *)0x0) {
      value.field_1.n = 1;
      value.isa = gravity_class_null;
    }
    else {
      sVar3 = strlen(__s);
      value = gravity_string_to_value(vm,__s,(uint32_t)sVar3);
    }
  }
  else {
    builtin_strncpy(local_1028 + 0x20," a string.",0xb);
    builtin_strncpy(local_1028 + 0x10,"able key must be",0x10);
    builtin_strncpy(local_1028,"Environment vari",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value.field_1.n = 0;
    value.isa = gravity_class_null;
  }
  gravity_vm_setslot(vm,value,rindex);
  return pgVar1 == pgVar2;
}

Assistant:

static bool gravity_env_get(gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    
    if(!VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("Environment variable key must be a string.");
    }

    char *key = VALUE_AS_CSTRING(args[1]);
    char *value = getenv(key);
    gravity_value_t rt = VALUE_FROM_UNDEFINED;

    // GRAVITY_DEBUG_PRINT("[ENV::GET args : %i] %s => %s\n", nargs, key, value);

    if (value) {
        rt = VALUE_FROM_STRING(vm, value, (uint32_t)strlen(value));
    }

    RETURN_VALUE(rt, rindex);
}